

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::visit(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Expression *curr)

{
  __index_type *__return_storage_ptr___00;
  Block *this_00;
  bool bVar1;
  optional<wasm::Type> type_;
  Ok local_ca;
  Visitor<wasm::ReFinalizeNode,_void> local_c9;
  undefined1 local_c8 [12];
  Block *local_b8;
  Block *block;
  Err local_a8;
  Err *local_88;
  Err *err;
  undefined1 local_70 [8];
  Result<wasm::Ok> _val;
  Result<wasm::Ok> val;
  Expression *curr_local;
  IRBuilder *this_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  Visitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visit
            ((Result<wasm::Ok> *)__return_storage_ptr___00,
             (Visitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,curr);
  Result<wasm::Ok>::Result
            ((Result<wasm::Ok> *)local_70,(Result<wasm::Ok> *)__return_storage_ptr___00);
  local_88 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_70);
  bVar1 = local_88 != (Err *)0x0;
  if (bVar1) {
    wasm::Err::Err(&local_a8,local_88);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_a8);
    wasm::Err::~Err(&local_a8);
  }
  block._4_4_ = (uint)bVar1;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_70);
  if (block._4_4_ == 0) {
    this_00 = Expression::dynCast<wasm::Block>(curr);
    local_b8 = this_00;
    if (this_00 == (Block *)0x0) {
      Visitor<wasm::ReFinalizeNode,_void>::visit(&local_c9,curr);
    }
    else {
      std::optional<wasm::Type>::optional<wasm::Type_&,_true>
                ((optional<wasm::Type> *)local_c8,
                 &(this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type
                );
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._12_4_ = 0;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)local_c8._0_8_;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_c8[8];
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_3_ = local_c8._9_3_;
      Block::finalize(this_00,type_,Unknown);
    }
    push(this,curr);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_ca);
    block._4_4_ = 1;
  }
  Result<wasm::Ok>::~Result
            ((Result<wasm::Ok> *)
             ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::visit(Expression* curr) {
  // Call either `visitExpression` or an expression-specific override.
  auto val = UnifiedExpressionVisitor<IRBuilder, Result<>>::visit(curr);
  CHECK_ERR(val);
  if (auto* block = curr->dynCast<Block>()) {
    block->finalize(block->type);
  } else {
    // TODO: Call more efficient versions of finalize() that take the known type
    // for other kinds of nodes as well, as done above.
    ReFinalizeNode{}.visit(curr);
  }
  push(curr);
  return Ok{};
}